

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_intersection_bitset_x_bitset(void)

{
  int iVar1;
  roaring_bitmap_t *r;
  roaring_bitmap_t *r_00;
  uint64_t uVar2;
  roaring_bitmap_t *r_01;
  uint64_t uVar3;
  long lVar4;
  unsigned_long b;
  unsigned_long b_00;
  
  b_00 = 0;
  r = roaring_bitmap_create_with_capacity(0);
  _assert_true((unsigned_long)r,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x6cf);
  r_00 = roaring_bitmap_create_with_capacity(0);
  _assert_true((unsigned_long)r_00,"r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x6d1);
  lVar4 = -60000;
  b = 4;
  do {
    roaring_bitmap_add(r,(uint32_t)b_00);
    iVar1 = (int)lVar4;
    roaring_bitmap_add(r_00,iVar1 + 60000);
    roaring_bitmap_add(r_00,iVar1 + 0xea61);
    roaring_bitmap_add(r,(uint32_t)b_00 | 0x50000);
    roaring_bitmap_add(r_00,iVar1 + 0x5ea60);
    roaring_bitmap_add(r_00,iVar1 + 0x5ea61);
    uVar2 = roaring_bitmap_get_cardinality(r);
    b_00 = b_00 + 2;
    _assert_int_equal(uVar2,b_00,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                      ,0x6db);
    uVar2 = roaring_bitmap_get_cardinality(r_00);
    _assert_int_equal(uVar2,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                      ,0x6dc);
    b = b + 4;
    lVar4 = lVar4 + 3;
  } while (lVar4 != 0);
  r_01 = roaring_bitmap_and(r,r_00);
  uVar2 = roaring_bitmap_get_cardinality(r_01);
  uVar3 = roaring_bitmap_and_cardinality(r,r_00);
  _assert_true((ulong)(uVar2 == uVar3),
               "roaring_bitmap_get_cardinality(r1_and_r2) == roaring_bitmap_and_cardinality(r1, r2)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x6e1);
  _assert_true((unsigned_long)r_01,"r1_and_r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x6e3);
  uVar2 = roaring_bitmap_get_cardinality(r_01);
  _assert_int_equal(uVar2,0x682a,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                    ,0x6e6);
  roaring_bitmap_free(r_01);
  roaring_bitmap_free(r_00);
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_intersection_bitset_x_bitset) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_true(r1);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    assert_true(r2);

    for (uint32_t i = 0; i < 20000; ++i) {
        roaring_bitmap_add(r1, 2 * i);
        roaring_bitmap_add(r2, 3 * i);
        roaring_bitmap_add(r2, 3 * i + 1);
        roaring_bitmap_add(r1, 5 * 65536 + 2 * i);
        roaring_bitmap_add(r2, 5 * 65536 + 3 * i);
        roaring_bitmap_add(r2, 5 * 65536 + 3 * i + 1);

        assert_int_equal(roaring_bitmap_get_cardinality(r1), 2 * (i + 1));
        assert_int_equal(roaring_bitmap_get_cardinality(r2), 4 * (i + 1));
    }

    roaring_bitmap_t *r1_and_r2 = roaring_bitmap_and(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_and_r2) ==
                roaring_bitmap_and_cardinality(r1, r2));

    assert_non_null(r1_and_r2);

    // NOT analytically determined but seems reasonable
    assert_int_equal(roaring_bitmap_get_cardinality(r1_and_r2), 26666);

    roaring_bitmap_free(r1_and_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);
}